

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_30c12::SwizzleTestBase<3U,_32849U>::runTest
          (SwizzleTestBase<3U,_32849U> *this,swizzle_e *swizzle)

{
  bool bVar1;
  VkFormat VVar2;
  swizzle_e *in_RSI;
  long in_RDI;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  uint32_t c;
  uint32_t i;
  color *dest;
  size_t srcByteLen;
  size_t destByteLen;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  ktx_error_code_e result;
  ktxTexture2 *texture;
  char (*in_stack_fffffffffffffda8) [28];
  AssertionResult *in_stack_fffffffffffffdb0;
  Message *in_stack_fffffffffffffdb8;
  Message *in_stack_fffffffffffffdc0;
  Message *in_stack_fffffffffffffdc8;
  Message *in_stack_fffffffffffffdd0;
  char *in_stack_fffffffffffffdd8;
  AssertHelper *in_stack_fffffffffffffde0;
  ktxTexture *in_stack_fffffffffffffde8;
  WriterTestHelper<unsigned_char,_3U,_32849U> *in_stack_fffffffffffffdf0;
  char *in_stack_fffffffffffffe10;
  char *in_stack_fffffffffffffe18;
  char *in_stack_fffffffffffffe20;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffe28;
  AssertHelper *in_stack_fffffffffffffe30;
  AssertionResult local_1b8 [2];
  undefined4 local_194;
  AssertionResult local_190;
  uint local_180;
  uint local_17c;
  uchar *local_178;
  ulong local_170;
  size_t local_168;
  string local_160 [55];
  undefined1 local_129;
  AssertionResult local_128;
  string local_118 [55];
  undefined1 local_e1;
  AssertionResult local_e0;
  string local_d0 [40];
  undefined8 local_a8;
  undefined1 local_91;
  AssertionResult local_90;
  uint local_7c;
  string local_78 [71];
  undefined1 local_31;
  AssertionResult local_30;
  ktx_error_code_e local_1c;
  long local_18;
  swizzle_e *local_10;
  
  local_10 = in_RSI;
  VVar2 = vkGetFormatFromOpenGLInternalFormat(*(GLenum *)(in_RDI + 0x100));
  *(VkFormat *)(in_RDI + 0x104) = VVar2;
  local_1c = ktxTexture2_Create(in_RDI + 0x100,1,&local_18);
  local_31 = local_1c == 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffdb0,(bool *)in_stack_fffffffffffffda8,(type *)0x1540db);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_30);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffde0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffffe28._M_head_impl,in_stack_fffffffffffffe20,
               in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffde0,(Type)((ulong)in_stack_fffffffffffffdd8 >> 0x20),
               (char *)in_stack_fffffffffffffdd0,(int)((ulong)in_stack_fffffffffffffdc8 >> 0x20),
               (char *)in_stack_fffffffffffffdc0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffe30,(Message *)in_stack_fffffffffffffe28._M_head_impl);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdb0);
    std::__cxx11::string::~string(local_78);
    testing::Message::~Message((Message *)0x15419c);
  }
  local_7c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x154246);
  if (local_7c == 0) {
    local_91 = local_18 != 0;
    testing::AssertionResult::AssertionResult<bool>
              (in_stack_fffffffffffffdb0,(bool *)in_stack_fffffffffffffda8,(type *)0x154286);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_90);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffde0);
      testing::Message::operator<<
                ((Message *)in_stack_fffffffffffffdb0,(char (*) [27])in_stack_fffffffffffffda8);
      local_a8 = ktxErrorString(local_1c);
      in_stack_fffffffffffffdf0 =
           (WriterTestHelper<unsigned_char,_3U,_32849U> *)
           testing::Message::operator<<
                     ((Message *)in_stack_fffffffffffffdb0,(char **)in_stack_fffffffffffffda8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)in_stack_fffffffffffffe28._M_head_impl,in_stack_fffffffffffffe20
                 ,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffde0,(Type)((ulong)in_stack_fffffffffffffdd8 >> 0x20),
                 (char *)in_stack_fffffffffffffdd0,(int)((ulong)in_stack_fffffffffffffdc8 >> 0x20),
                 (char *)in_stack_fffffffffffffdc0);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffe30,(Message *)in_stack_fffffffffffffe28._M_head_impl);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdb0);
      std::__cxx11::string::~string(local_d0);
      testing::Message::~Message((Message *)0x1543aa);
    }
    local_7c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x154454);
    if (local_7c == 0) {
      local_e1 = *(long *)(local_18 + 0x70) != 0;
      testing::AssertionResult::AssertionResult<bool>
                (in_stack_fffffffffffffdb0,(bool *)in_stack_fffffffffffffda8,(type *)0x154498);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e0);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffde0);
        in_stack_fffffffffffffde8 =
             (ktxTexture *)
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((AssertionResult *)in_stack_fffffffffffffe28._M_head_impl,
                   in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
        std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffde0,(Type)((ulong)in_stack_fffffffffffffdd8 >> 0x20),
                   (char *)in_stack_fffffffffffffdd0,(int)((ulong)in_stack_fffffffffffffdc8 >> 0x20)
                   ,(char *)in_stack_fffffffffffffdc0);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffe30,(Message *)in_stack_fffffffffffffe28._M_head_impl);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdb0);
        std::__cxx11::string::~string(local_118);
        testing::Message::~Message((Message *)0x154583);
      }
      local_7c = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x154630);
      if (local_7c == 0) {
        local_1c = WriterTestHelper<unsigned_char,_3U,_32849U>::copyImagesToTexture
                             (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
        local_129 = local_1c == KTX_SUCCESS;
        testing::AssertionResult::AssertionResult<bool>
                  (in_stack_fffffffffffffdb0,(bool *)in_stack_fffffffffffffda8,(type *)0x15468c);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_128);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffde0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((AssertionResult *)in_stack_fffffffffffffe28._M_head_impl,
                     in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
          std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffde0,(Type)((ulong)in_stack_fffffffffffffdd8 >> 0x20),
                     (char *)in_stack_fffffffffffffdd0,
                     (int)((ulong)in_stack_fffffffffffffdc8 >> 0x20),
                     (char *)in_stack_fffffffffffffdc0);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffe30,(Message *)in_stack_fffffffffffffe28._M_head_impl);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdb0);
          std::__cxx11::string::~string(local_160);
          testing::Message::~Message((Message *)0x15475f);
        }
        local_7c = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x15480c);
        if (local_7c == 0) {
          local_168 = (size_t)(uint)(*(int *)(in_RDI + 0x150) * *(int *)(in_RDI + 0x154) * 4);
          local_170 = (ulong)(uint)(*(int *)(in_RDI + 0x150) * *(int *)(in_RDI + 0x154) * 3);
          local_178 = (uchar *)malloc(local_168);
          memset(local_178,0x7f,local_168);
          swizzle_to_rgba(local_178,*(uchar **)(local_18 + 0x70),3,local_170,local_10);
          for (local_17c = 0;
              local_17c < (uint)(*(int *)(in_RDI + 0x150) * *(int *)(in_RDI + 0x154));
              local_17c = local_17c + 1) {
            for (local_180 = 0; local_180 < 4; local_180 = local_180 + 1) {
              if (local_10[local_180] == ZERO) {
                local_194 = 0;
                testing::internal::EqHelper::Compare<unsigned_char,_int,_nullptr>
                          ((char *)in_stack_fffffffffffffdc8,(char *)in_stack_fffffffffffffdc0,
                           (uchar *)in_stack_fffffffffffffdb8,(int *)in_stack_fffffffffffffdb0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_190);
                if (!bVar1) {
                  testing::Message::Message((Message *)in_stack_fffffffffffffde0);
                  in_stack_fffffffffffffde0 =
                       (AssertHelper *)
                       testing::AssertionResult::failure_message((AssertionResult *)0x1549ae);
                  testing::internal::AssertHelper::AssertHelper
                            (in_stack_fffffffffffffde0,
                             (Type)((ulong)in_stack_fffffffffffffdd8 >> 0x20),
                             (char *)in_stack_fffffffffffffdd0,
                             (int)((ulong)in_stack_fffffffffffffdc8 >> 0x20),
                             (char *)in_stack_fffffffffffffdc0);
                  testing::internal::AssertHelper::operator=
                            (in_stack_fffffffffffffe30,
                             (Message *)in_stack_fffffffffffffe28._M_head_impl);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)in_stack_fffffffffffffdb0);
                  testing::Message::~Message((Message *)0x154a0b);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)0x154a76);
              }
              else if (local_10[local_180] == ONE) {
                testing::internal::EqHelper::Compare<unsigned_char,_int,_nullptr>
                          ((char *)in_stack_fffffffffffffdc8,(char *)in_stack_fffffffffffffdc0,
                           (uchar *)in_stack_fffffffffffffdb8,(int *)in_stack_fffffffffffffdb0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1b8);
                if (!bVar1) {
                  testing::Message::Message((Message *)in_stack_fffffffffffffde0);
                  in_stack_fffffffffffffdd8 =
                       testing::AssertionResult::failure_message((AssertionResult *)0x154b28);
                  testing::internal::AssertHelper::AssertHelper
                            (in_stack_fffffffffffffde0,
                             (Type)((ulong)in_stack_fffffffffffffdd8 >> 0x20),
                             (char *)in_stack_fffffffffffffdd0,
                             (int)((ulong)in_stack_fffffffffffffdc8 >> 0x20),
                             (char *)in_stack_fffffffffffffdc0);
                  testing::internal::AssertHelper::operator=
                            (in_stack_fffffffffffffe30,
                             (Message *)in_stack_fffffffffffffe28._M_head_impl);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)in_stack_fffffffffffffdb0);
                  testing::Message::~Message((Message *)0x154b85);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)0x154bf0);
              }
              else {
                testing::internal::EqHelper::Compare<swizzle_e,_unsigned_char,_nullptr>
                          ((char *)in_stack_fffffffffffffdc8,(char *)in_stack_fffffffffffffdc0,
                           (swizzle_e *)in_stack_fffffffffffffdb8,
                           &in_stack_fffffffffffffdb0->success_);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)&stack0xfffffffffffffe20);
                if (!bVar1) {
                  testing::Message::Message((Message *)in_stack_fffffffffffffde0);
                  in_stack_fffffffffffffdd0 =
                       testing::Message::operator<<
                                 ((Message *)in_stack_fffffffffffffdb0,
                                  (char (*) [5])in_stack_fffffffffffffda8);
                  in_stack_fffffffffffffdc8 =
                       testing::Message::operator<<
                                 ((Message *)in_stack_fffffffffffffdb0,
                                  (uint *)in_stack_fffffffffffffda8);
                  in_stack_fffffffffffffdc0 =
                       testing::Message::operator<<
                                 ((Message *)in_stack_fffffffffffffdb0,
                                  (char (*) [7])in_stack_fffffffffffffda8);
                  in_stack_fffffffffffffdb8 =
                       testing::Message::operator<<
                                 ((Message *)in_stack_fffffffffffffdb0,
                                  (uint *)in_stack_fffffffffffffda8);
                  in_stack_fffffffffffffdb0 =
                       (AssertionResult *)
                       testing::AssertionResult::failure_message((AssertionResult *)0x154ce2);
                  testing::internal::AssertHelper::AssertHelper
                            (in_stack_fffffffffffffde0,
                             (Type)((ulong)in_stack_fffffffffffffdd8 >> 0x20),
                             (char *)in_stack_fffffffffffffdd0,
                             (int)((ulong)in_stack_fffffffffffffdc8 >> 0x20),
                             (char *)in_stack_fffffffffffffdc0);
                  testing::internal::AssertHelper::operator=
                            (in_stack_fffffffffffffe30,
                             (Message *)in_stack_fffffffffffffe28._M_head_impl);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)in_stack_fffffffffffffdb0);
                  testing::Message::~Message((Message *)0x154d30);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)0x154d92);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void runTest(swizzle_e swizzle[4]) {
        ktxTexture2* texture;
        ktx_error_code_e result;

        helper.texinfo.vkFormat
                = vkGetFormatFromOpenGLInternalFormat(helper.texinfo.glInternalformat);
        result = ktxTexture2_Create(&helper.texinfo,
                                    KTX_TEXTURE_CREATE_ALLOC_STORAGE,
                                    &texture);
        ASSERT_TRUE(result == KTX_SUCCESS);
        ASSERT_TRUE(texture != NULL) << "ktxTexture_Create failed: "
                                     << ktxErrorString(result);
        ASSERT_TRUE(texture->pData != NULL) << "Image storage not allocated";

        result = helper.copyImagesToTexture(ktxTexture(texture));
        ASSERT_TRUE(result == KTX_SUCCESS);

        size_t destByteLen = width * height * 4 * sizeof(GLubyte);
        size_t srcByteLen = width * height * num_components * sizeof(GLubyte);
        typedef GLubyte color[4];
        color* dest = (color*)malloc(destByteLen);
        memset(dest, 0x7f, destByteLen);
        swizzle_to_rgba((uint8_t*)dest,
                        texture->pData,
                        num_components,
                        srcByteLen,
                        swizzle);

       for (uint32_t i = 0; i < width * height; i++) {
           for (uint32_t c = 0; c < 4; c++) {
               if (swizzle[c] == ZERO)
                   EXPECT_EQ(dest[i][c], 0);
               else if (swizzle[c] == ONE)
                   EXPECT_EQ(dest[i][c], 255);
               else
                   EXPECT_EQ(swizzle[c], dest[i][c]) << "c = " << c << ", i = "  << i;
           }
       }
    }